

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit_h(uint8_t *digest,commitments_t *C,picnic_instance_t *params)

{
  long in_RDX;
  size_t i;
  hash_context ctx;
  uint8_t *in_stack_fffffffffffffef8;
  hash_context *in_stack_ffffffffffffff00;
  hash_context *ctx_00;
  
  hash_init(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
  for (ctx_00 = (hash_context *)0x0; ctx_00 < (hash_context *)(ulong)*(byte *)(in_RDX + 0xb);
      ctx_00 = (hash_context *)((ctx_00->sponge).state + 1)) {
    hash_update(ctx_00,in_stack_fffffffffffffef8,0x140ec2);
  }
  hash_final((hash_context *)0x140edc);
  hash_squeeze(ctx_00,in_stack_fffffffffffffef8,0x140efc);
  return;
}

Assistant:

static void commit_h(uint8_t* digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, C->hashes[i], params->digest_size);
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}